

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,format_specs *specs,char_writer *f)

{
  byte bVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  byte bVar5;
  size_t size;
  char_type *__s;
  char_type *pcVar6;
  size_t __len_1;
  ulong uVar7;
  char __tmp;
  buffer<char> *c;
  ulong uVar8;
  
  uVar2 = specs->width;
  uVar8 = (ulong)uVar2;
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  if (uVar8 < 2) {
    uVar8 = lVar4 + 1;
    if ((ulong)puVar3[3] < uVar8) {
      (**(code **)*puVar3)(puVar3,uVar8);
    }
    puVar3[2] = uVar8;
    *(char_type *)(puVar3[1] + lVar4) = f->value;
  }
  else {
    uVar7 = lVar4 + uVar8;
    if ((ulong)puVar3[3] < uVar7) {
      (**(code **)*puVar3)(puVar3,uVar7);
    }
    puVar3[2] = uVar7;
    __s = (char_type *)(lVar4 + puVar3[1]);
    bVar1 = (specs->fill).data_[0];
    uVar8 = uVar8 - 1;
    bVar5 = specs->field_0x9 & 0xf;
    pcVar6 = __s;
    if (bVar5 == 3) {
      uVar7 = uVar8 >> 1;
      if (uVar2 != 2) {
        pcVar6 = __s + uVar7;
        memset(__s,(uint)bVar1,uVar7);
      }
      *pcVar6 = f->value;
      if (uVar8 != 0) {
        uVar8 = uVar8 - uVar7;
        goto LAB_0014a7aa;
      }
    }
    else {
      if (bVar5 != 2) {
        *__s = f->value;
LAB_0014a7aa:
        memset(pcVar6 + 1,(uint)bVar1,uVar8);
        return;
      }
      memset(__s,(uint)bVar1,uVar8);
      __s[uVar8] = f->value;
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }